

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseInline(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Bool BVar5;
  int iVar6;
  NodeType NVar7;
  Node *pNVar8;
  Dict *pDVar9;
  tmbstr ptVar10;
  Node *pNVar11;
  uint code;
  Node **ppNVar12;
  uint uVar13;
  GetTokenMode mode_00;
  
  if ((element->tag->model & 1) != 0) {
    return;
  }
  pLVar2 = doc->lexer;
  uVar13 = 8;
  BVar5 = prvTidynodeHasCM(element,8);
  if (((BVar5 == no) && ((element->tag == (Dict *)0x0 || (element->tag->id != TidyTag_DT)))) ||
     (BVar5 = prvTidynodeHasCM(element,0x20000), BVar5 != no)) {
    BVar5 = prvTidynodeHasCM(element,0x10);
    if (BVar5 != no) {
      prvTidyPushInline(doc,element);
    }
  }
  else {
    prvTidyInlineDup(doc,(Node *)0x0);
  }
  if (element->tag != (Dict *)0x0) {
    TVar1 = element->tag->id;
    if (TVar1 == TidyTag_NOBR) {
      uVar13 = 4;
    }
    else if (TVar1 != TidyTag_FONT) goto LAB_0013fa1b;
    doc->badLayout = doc->badLayout | uVar13;
  }
LAB_0013fa1b:
  mode_00 = (mode == Preformatted) + MixedContent;
LAB_0013fa28:
  pNVar8 = prvTidyGetToken(doc,mode_00);
  if (pNVar8 == (Node *)0x0) {
    if ((element->tag->model & 0x8000) != 0) {
      return;
    }
    prvTidyReport(doc,element,(Node *)0x0,0x25a);
    return;
  }
  if (pNVar8->tag == element->tag) {
    if (pNVar8->type != StartTag) {
      if (pNVar8->type == EndTag) {
        if ((element->tag->model & 0x10) != 0) {
          prvTidyPopInline(doc,pNVar8);
        }
        prvTidyFreeNode(doc,pNVar8);
        if (mode != Preformatted) {
          TrimSpaces(doc,element);
        }
        if ((((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_FONT)) &&
            (pNVar8 = element->content, pNVar8 != (Node *)0x0)) &&
           (((pNVar8 == element->last && (pNVar8->tag != (Dict *)0x0)) &&
            (pNVar8->tag->id == TidyTag_A)))) {
          pNVar8->next = element->next;
          pNVar11 = element->prev;
          pNVar8->parent = element->parent;
          pNVar8->prev = pNVar11;
          element->prev = (Node *)0x0;
          element->next = (Node *)0x0;
          element->parent = pNVar8;
          pNVar11 = pNVar8->last;
          element->content = pNVar8->content;
          element->last = pNVar11;
          pNVar8->content = element;
          prvTidyFixNodeLinks(pNVar8);
          prvTidyFixNodeLinks(element);
        }
        element->closed = yes;
        goto LAB_001404e5;
      }
      goto LAB_0013fa7d;
    }
    BVar5 = prvTidyIsPushed(doc,pNVar8);
    if (((BVar5 == no) || (pNVar8->implicit != no)) ||
       ((element->implicit != no ||
        ((pDVar9 = pNVar8->tag, pDVar9 == (Dict *)0x0 || ((pDVar9->model & 0x10) == 0))))))
    goto LAB_0013fa7d;
    TVar1 = pDVar9->id;
    if (((TVar1 - TidyTag_Q < 0x15) && ((0x18a001U >> (TVar1 - TidyTag_Q & 0x1f) & 1) != 0)) ||
       (((TVar1 < TidyTag_FORM && ((0x1000002002U >> ((ulong)TVar1 & 0x3f) & 1) != 0)) ||
        (*(int *)((doc->config).value + 9) == 0)))) goto LAB_0013fa7d;
    if (((element->content == (Node *)0x0) || (pNVar8->attributes != (AttVal *)0x0)) ||
       ((BVar5 = prvTidynodeIsText(element->last), BVar5 == no ||
        (BVar5 = prvTidyTextNodeEndWithSpace(doc->lexer,element->last), BVar5 != no)))) {
      if ((pNVar8->attributes == (AttVal *)0x0) || (element->attributes == (AttVal *)0x0)) {
        code = 0x264;
        goto LAB_0013fabe;
      }
      goto LAB_0013fac5;
    }
    prvTidyReport(doc,element,pNVar8,0x232);
    pNVar8->type = EndTag;
    goto LAB_00140134;
  }
LAB_0013fa7d:
  BVar5 = prvTidyIsPushed(doc,pNVar8);
  if ((((BVar5 != no) && (pNVar8->type == StartTag)) && (pNVar8->tag != (Dict *)0x0)) &&
     ((pNVar8->tag->id == TidyTag_Q && (iVar6 = prvTidyHTMLVersion(doc), iVar6 != 0x20000)))) {
    code = 0x265;
LAB_0013fabe:
    prvTidyReport(doc,element,pNVar8,code);
  }
LAB_0013fac5:
  BVar5 = prvTidynodeIsText(pNVar8);
  if (BVar5 == no) goto LAB_0013fb19;
  if ((mode != Preformatted) && (element->content == (Node *)0x0)) {
    TrimSpaces(doc,element);
  }
  if (pNVar8->end <= pNVar8->start) goto LAB_0013fb63;
  pNVar8->parent = element;
  pNVar11 = element->last;
  pNVar8->prev = pNVar11;
  ppNVar12 = &pNVar11->next;
  if (pNVar11 == (Node *)0x0) {
    ppNVar12 = &element->content;
  }
  goto LAB_0013fb0d;
LAB_0013fb19:
  BVar5 = InsertMisc(element,pNVar8);
  if (BVar5 != no) goto LAB_0013fa28;
  if (pNVar8->tag == (Dict *)0x0) goto LAB_0013fb4e;
  TVar1 = pNVar8->tag->id;
  if (TVar1 == TidyTag_HTML) {
    BVar5 = prvTidynodeIsElement(pNVar8);
    if (BVar5 != no) goto LAB_0013fb4e;
    goto LAB_00140427;
  }
  if (TVar1 == TidyTag_P) {
    NVar7 = pNVar8->type;
    if (NVar7 == StartTag) {
      if ((mode == Preformatted) ||
         (((element->tag != (Dict *)0x0 && (element->tag->id == TidyTag_DT)) ||
          (BVar5 = DescendantOf(element,TidyTag_DT), BVar5 != no)))) {
        pDVar9 = prvTidyLookupTagDef(TidyTag_BR);
        pNVar8->tag = pDVar9;
        (*doc->allocator->vtbl->free)(doc->allocator,pNVar8->element);
        ptVar10 = prvTidytmbstrdup(doc->allocator,"br");
        pNVar8->element = ptVar10;
        TrimSpaces(doc,element);
        pNVar8->parent = element;
        pNVar11 = element->last;
        pNVar8->prev = pNVar11;
        ppNVar12 = &pNVar11->next;
        if (pNVar11 == (Node *)0x0) {
          ppNVar12 = &element->content;
        }
LAB_0013fb0d:
        *ppNVar12 = pNVar8;
        element->last = pNVar8;
        goto LAB_0013fa28;
      }
      if ((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_ADDRESS)) {
        prvTidyConstrainVersion(doc,0xfffffedb);
        pNVar8->parent = element;
        pNVar11 = element->last;
        ppNVar12 = &pNVar11->next;
        if (pNVar11 == (Node *)0x0) {
          ppNVar12 = &element->content;
        }
        pNVar8->prev = pNVar11;
        *ppNVar12 = pNVar8;
        element->last = pNVar8;
        (*pNVar8->tag->parser)(doc,pNVar8,MixedContent);
        goto LAB_0013fa28;
      }
      NVar7 = pNVar8->type;
    }
    if ((NVar7 == EndTag) && (BVar5 = DescendantOf(element,TidyTag_P), BVar5 == no)) {
      prvTidyCoerceNode(doc,pNVar8,TidyTag_BR,no,no);
      TrimSpaces(doc,element);
      pNVar8->parent = element;
      pNVar11 = element->last;
      pNVar8->prev = pNVar11;
      ppNVar12 = &pNVar11->next;
      if (pNVar11 == (Node *)0x0) {
        ppNVar12 = &element->content;
      }
      *ppNVar12 = pNVar8;
      element->last = pNVar8;
      pNVar11 = prvTidyInferredTag(doc,TidyTag_BR);
      pNVar11->parent = element;
      pNVar8 = element->last;
      pNVar11->prev = pNVar8;
      ppNVar12 = &pNVar8->next;
      if (pNVar8 == (Node *)0x0) {
        ppNVar12 = &element->content;
      }
      *ppNVar12 = pNVar11;
      element->last = pNVar11;
      goto LAB_0013fa28;
    }
LAB_0013fe26:
    BVar5 = prvTidynodeHasCM(pNVar8,0x4000);
    if ((BVar5 == no) || (BVar5 = prvTidynodeHasCM(element,0x4000), BVar5 == no)) {
      pDVar9 = pNVar8->tag;
      if (((pDVar9 == (Dict *)0x0) || ((pDVar9->id != TidyTag_A || (pNVar8->implicit != no)))) ||
         (((element->tag == (Dict *)0x0 || (element->tag->id != TidyTag_A)) &&
          (BVar5 = DescendantOf(element,TidyTag_A), BVar5 == no)))) {
        pDVar3 = element->tag;
        uVar13 = pDVar3->model;
        if ((uVar13 >> 0xe & 1) == 0) {
          if (((pDVar9 != (Dict *)0x0) && (pDVar3->id == TidyTag_DT)) && (pDVar9->id == TidyTag_HR))
          {
            BVar5 = prvTidynodeIsElement(pNVar8);
            if (BVar5 != no) {
              prvTidyReport(doc,element,pNVar8,0x27e);
              pNVar11 = prvTidyInferredTag(doc,TidyTag_DD);
              if (element->content == (Node *)0x0) {
                prvTidyInsertNodeBeforeElement(element,pNVar11);
                pNVar8->parent = pNVar11;
                pNVar4 = pNVar11->last;
                pNVar8->prev = pNVar4;
                ppNVar12 = &pNVar4->next;
                if (pNVar4 == (Node *)0x0) {
                  ppNVar12 = &pNVar11->content;
                }
                *ppNVar12 = pNVar8;
                pNVar11->last = pNVar8;
                goto LAB_0013fa28;
              }
              prvTidyInsertNodeAfterElement(element,pNVar11);
              pNVar8->parent = pNVar11;
              pNVar4 = pNVar11->last;
              ppNVar12 = &pNVar4->next;
              if (pNVar4 == (Node *)0x0) {
                ppNVar12 = &pNVar11->content;
              }
              pNVar8->prev = pNVar4;
              *ppNVar12 = pNVar8;
              pNVar11->last = pNVar8;
              if (mode != Preformatted) {
                TrimSpaces(doc,element);
              }
              element = prvTidyCloneNode(doc,element);
              pNVar8 = pNVar11;
LAB_0014019d:
              prvTidyInsertNodeAfterElement(pNVar8,element);
              goto LAB_0013fa28;
            }
            goto LAB_0013fb4e;
          }
        }
        else if (pDVar9 != (Dict *)0x0) {
          TVar1 = pDVar9->id;
          if (TVar1 != TidyTag_CENTER) {
            if (TVar1 == TidyTag_HR) {
              BVar5 = prvTidynodeIsElement(pNVar8);
              if (BVar5 != no) {
                prvTidyReport(doc,element,pNVar8,0x27e);
                if (element->content == (Node *)0x0) {
                  prvTidyInsertNodeBeforeElement(element,pNVar8);
                  goto LAB_0013fa28;
                }
                prvTidyInsertNodeAfterElement(element,pNVar8);
                if (mode != Preformatted) {
                  TrimSpaces(doc,element);
                }
                element = prvTidyCloneNode(doc,element);
                goto LAB_0014019d;
              }
              goto LAB_0013fb4e;
            }
            if (TVar1 != TidyTag_DIV) goto LAB_0013ffd5;
          }
          BVar5 = prvTidynodeIsElement(pNVar8);
          if (BVar5 != no) {
            prvTidyReport(doc,element,pNVar8,0x27e);
            if (element->content == (Node *)0x0) {
              pNVar8->content = element;
              pNVar8->last = element;
              pNVar8->parent = element->parent;
              element->parent = pNVar8;
              pNVar11 = pNVar8->parent;
              if (pNVar11->content == element) {
                pNVar11->content = pNVar8;
              }
              if (pNVar11->last == element) {
                pNVar11->last = pNVar8;
              }
              pNVar8->prev = element->prev;
              element->prev = (Node *)0x0;
              if (pNVar8->prev != (Node *)0x0) {
                pNVar8->prev->next = pNVar8;
              }
              pNVar8->next = element->next;
              element->next = (Node *)0x0;
              if (pNVar8->next != (Node *)0x0) {
                pNVar8->next->prev = pNVar8;
              }
            }
            else {
              prvTidyInsertNodeAfterElement(element,pNVar8);
              if (mode != Preformatted) {
                TrimSpaces(doc,element);
              }
              element = prvTidyCloneNode(doc,element);
              element->parent = pNVar8;
              pNVar11 = pNVar8->last;
              element->prev = pNVar11;
              ppNVar12 = &pNVar11->next;
              if (pNVar11 == (Node *)0x0) {
                ppNVar12 = &pNVar8->content;
              }
              *ppNVar12 = element;
              pNVar8->last = element;
            }
            goto LAB_0013fa28;
          }
          goto LAB_0013fb4e;
        }
LAB_0013ffd5:
        pNVar11 = element;
        if (pNVar8->type == EndTag) {
          while (pNVar11 = pNVar11->parent, pNVar11 != (Node *)0x0) {
            if (pDVar9 == pNVar11->tag) {
              if ((-1 < (short)uVar13) && (element->implicit == no)) {
                prvTidyReport(doc,element,pNVar8,0x259);
              }
              BVar5 = prvTidyIsPushedLast(doc,element,pNVar8);
              if (BVar5 == no) goto LAB_00140427;
              goto LAB_0014041c;
            }
          }
        }
        if (((uVar13 & 0x20000) != 0 || (pDVar9->model & 0x10) != 0) ||
           (((pDVar3 != (Dict *)0x0 && (pDVar9 != (Dict *)0x0)) &&
            ((pDVar3->id == TidyTag_SPAN && (pDVar9->id == TidyTag_META)))))) {
          BVar5 = prvTidynodeIsElement(pNVar8);
          if (BVar5 != no) {
            if (pNVar8->implicit != no) {
              prvTidyReport(doc,element,pNVar8,0x247);
            }
            if ((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_BR)) {
              TrimSpaces(doc,element);
            }
            pNVar8->parent = element;
            pNVar11 = element->last;
            pNVar8->prev = pNVar11;
            ppNVar12 = &pNVar11->next;
            if (pNVar11 == (Node *)0x0) {
              ppNVar12 = &element->content;
            }
            *ppNVar12 = pNVar8;
            element->last = pNVar8;
            ParseTag(doc,pNVar8,mode_00);
            goto LAB_0013fa28;
          }
LAB_0013fb4e:
          prvTidyReport(doc,element,pNVar8,0x235);
LAB_0013fb63:
          prvTidyFreeNode(doc,pNVar8);
          goto LAB_0013fa28;
        }
        BVar5 = prvTidynodeIsElement(pNVar8);
        if (BVar5 == no) goto LAB_0013fb4e;
        pDVar9 = element->tag;
        if ((pDVar9 == (Dict *)0x0) || (pDVar9->id != TidyTag_DATALIST)) {
          if ((pDVar9->model & 0x8000) == 0) {
            prvTidyReport(doc,element,pNVar8,0x259);
          }
        }
        else {
          prvTidyConstrainVersion(doc,0xfff9ffff);
        }
        uVar13 = pNVar8->tag->model;
        if ((uVar13 & 0xc) == 4) {
          MoveToHead(doc,element,pNVar8);
          goto LAB_0013fa28;
        }
        if ((element->tag != (Dict *)0x0) && (element->tag->id == TidyTag_A)) {
          if ((uVar13 >> 0xe & 1) == 0) {
LAB_0014041c:
            prvTidyPopInline(doc,element);
          }
          else if (element->content == (Node *)0x0) {
            prvTidyDiscardElement(doc,element);
            prvTidyUngetToken(doc);
            return;
          }
        }
        goto LAB_00140427;
      }
      if (((pNVar8->type != EndTag) && (pNVar8->attributes == (AttVal *)0x0)) &&
         (*(int *)((doc->config).value + 9) != 0)) {
        pNVar8->type = EndTag;
        prvTidyReport(doc,element,pNVar8,0x232);
LAB_00140134:
        prvTidyUngetToken(doc);
        goto LAB_0013fa28;
      }
      prvTidyUngetToken(doc);
      prvTidyReport(doc,element,pNVar8,0x259);
    }
    else if (pNVar8->tag == element->tag) {
LAB_00140567:
      prvTidyReport(doc,element,pNVar8,0x268);
      prvTidyFreeNode(doc,pNVar8);
    }
    else {
LAB_00140455:
      prvTidyReport(doc,element,pNVar8,0x259);
LAB_00140427:
      prvTidyUngetToken(doc);
    }
  }
  else {
    if (TVar1 == TidyTag_BR) {
      if (pNVar8->type == EndTag) {
        pNVar8->type = StartTag;
      }
      goto LAB_0013fe26;
    }
    if (TVar1 == TidyTag_PARAM) goto LAB_0013fb4e;
    if (pNVar8->type != EndTag) goto LAB_0013fe26;
    BVar5 = prvTidynodeHasCM(pNVar8,0x10);
    if ((((BVar5 == no) || ((pNVar8->tag != (Dict *)0x0 && (pNVar8->tag->id == TidyTag_A)))) ||
        (BVar5 = prvTidynodeHasCM(pNVar8,0x800), BVar5 != no)) ||
       (BVar5 = prvTidynodeHasCM(element,0x10), BVar5 == no)) {
      if ((pLVar2->exiled != no) &&
         ((BVar5 = prvTidynodeHasCM(pNVar8,0x80), BVar5 != no ||
          ((pNVar8->tag != (Dict *)0x0 && (pNVar8->tag->id == TidyTag_TABLE)))))) {
        prvTidyUngetToken(doc);
        goto LAB_001404e5;
      }
      goto LAB_0013fe26;
    }
    pDVar9 = element->tag;
    if ((((pDVar9 != (Dict *)0x0) && (pDVar9->id == TidyTag_A)) || (pNVar8->tag == pDVar9)) ||
       (((BVar5 = prvTidyIsPushed(doc,pNVar8), BVar5 == no ||
         (BVar5 = prvTidyIsPushed(doc,element), BVar5 == no)) ||
        (BVar5 = prvTidySwitchInline(doc,element,pNVar8), BVar5 == no)))) {
      prvTidyPopInline(doc,element);
      pDVar9 = element->tag;
      if ((pDVar9 != (Dict *)0x0) && (pDVar9->id == TidyTag_A)) goto LAB_0013fb4e;
      pDVar3 = pNVar8->tag;
      if ((pDVar3 != (Dict *)0x0) && (pDVar3 != pDVar9 && pDVar3->id == TidyTag_A))
      goto LAB_00140455;
      goto LAB_00140567;
    }
    prvTidyReport(doc,element,pNVar8,0x268);
    prvTidyUngetToken(doc);
    prvTidyInlineDup1(doc,(Node *)0x0,element);
  }
  if (mode == Preformatted) {
    return;
  }
LAB_001404e5:
  TrimSpaces(doc,element);
  return;
}

Assistant:

void TY_(ParseInline)( TidyDocImpl* doc, Node *element, GetTokenMode mode )
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_inline = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_inline++;
    SPRTF("Entering ParseInline %d...\n",in_parse_inline);
#endif

    if (element->tag->model & CM_EMPTY) {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_inline--;
        SPRTF("Exit ParseInline 1 %d...\n",in_parse_inline);
#endif
        return;
    }

    /*
     ParseInline is used for some block level elements like H1 to H6
     For such elements we need to insert inline emphasis tags currently
     on the inline stack. For Inline elements, we normally push them
     onto the inline stack provided they aren't implicit or OBJECT/APPLET.
     This test is carried out in PushInline and PopInline, see istack.c

     InlineDup(...) is not called for elements with a CM_MIXED (inline and
     block) content model, e.g. <del> or <ins>, otherwise constructs like 

       <p>111<a name='foo'>222<del>333</del>444</a>555</p>
       <p>111<span>222<del>333</del>444</span>555</p>
       <p>111<em>222<del>333</del>444</em>555</p>

     will get corrupted.
    */
    if ((TY_(nodeHasCM)(element, CM_BLOCK) || nodeIsDT(element)) &&
        !TY_(nodeHasCM)(element, CM_MIXED))
        TY_(InlineDup)(doc, NULL);
    else if (TY_(nodeHasCM)(element, CM_INLINE))
        TY_(PushInline)(doc, element);

    if ( nodeIsNOBR(element) )
        doc->badLayout |= USING_NOBR;
    else if ( nodeIsFONT(element) )
        doc->badLayout |= USING_FONT;

    /* Inline elements may or may not be within a preformatted element */
    if (mode != Preformatted)
        mode = MixedContent;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* end tag for current element */
        if (node->tag == element->tag && node->type == EndTag)
        {
            if (element->tag->model & CM_INLINE)
                TY_(PopInline)( doc, node );

            TY_(FreeNode)( doc, node );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

            /*
             if a font element wraps an anchor and nothing else
             then move the font element inside the anchor since
             otherwise it won't alter the anchor text color
            */
            if ( nodeIsFONT(element) && 
                 element->content && element->content == element->last )
            {
                Node *child = element->content;

                if ( nodeIsA(child) )
                {
                    child->parent = element->parent;
                    child->next = element->next;
                    child->prev = element->prev;

                    element->next = NULL;
                    element->prev = NULL;
                    element->parent = child;

                    element->content = child->content;
                    element->last = child->last;
                    child->content = element;

                    TY_(FixNodeLinks)(child);
                    TY_(FixNodeLinks)(element);
                }
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 2 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* <u>...<u>  map 2nd <u> to </u> if 1st is explicit */
        /* (see additional conditions below) */
        /* otherwise emphasis nesting is probably unintentional */
        /* big, small, sub, sup have cumulative effect to leave them alone */
        if ( node->type == StartTag
             && node->tag == element->tag
             && TY_(IsPushed)( doc, node )
             && !node->implicit
             && !element->implicit
             && node->tag && (node->tag->model & CM_INLINE)
             && !nodeIsA(node)
             && !nodeIsFONT(node)
             && !nodeIsBIG(node)
             && !nodeIsSMALL(node)
             && !nodeIsSUB(node)
             && !nodeIsSUP(node)
             && !nodeIsQ(node)
             && !nodeIsSPAN(node)
             && cfgBool(doc, TidyCoerceEndTags)
           )
        {
            /* proceeds only if "node" does not have any attribute and
               follows a text node not finishing with a space */
            if (element->content != NULL && node->attributes == NULL
                && TY_(nodeIsText)(element->last)
                && !TY_(TextNodeEndWithSpace)(doc->lexer, element->last) )
            {
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                node->type = EndTag;
                TY_(UngetToken)(doc);
                continue;
            }

            if (node->attributes == NULL || element->attributes == NULL)
                TY_(Report)(doc, element, node, NESTED_EMPHASIS);
        }
        else if ( TY_(IsPushed)(doc, node) && node->type == StartTag && 
                  nodeIsQ(node) )
        {
            /*\
             * Issue #215 - such nested quotes are NOT a problem if HTML5, so
             * only issue this warning if NOT HTML5 mode.
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(Report)(doc, element, node, NESTED_QUOTATION);
            }
        }

        if ( TY_(nodeIsText)(node) )
        {
            /* only called for 1st child */
            if ( element->content == NULL && !(mode & Preformatted) )
                TrimSpaces( doc, element );

            if ( node->start >= node->end )
            {
                TY_(FreeNode)( doc, node );
                continue;
            }

            TY_(InsertNodeAtEnd)(element, node);
            continue;
        }

        /* mixed content model so allow text */
        if (InsertMisc(element, node))
            continue;

        /* deal with HTML tags */
        if ( nodeIsHTML(node) )
        {
            if ( TY_(nodeIsElement)(node) )
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* otherwise infer end of inline element */
            TY_(UngetToken)( doc );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 3 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* within <dt> or <pre> map <p> to <br> */
        if ( nodeIsP(node) &&
             node->type == StartTag &&
             ( (mode & Preformatted) ||
               nodeIsDT(element) || 
               DescendantOf(element, TidyTag_DT )
             )
           )
        {
            node->tag = TY_(LookupTagDef)( TidyTag_BR );
            TidyDocFree(doc, node->element);
            node->element = TY_(tmbstrdup)(doc->allocator, "br");
            TrimSpaces(doc, element);
            TY_(InsertNodeAtEnd)(element, node);
            continue;
        }

        /* <p> allowed within <address> in HTML 4.01 Transitional */
        if ( nodeIsP(node) &&
             node->type == StartTag &&
             nodeIsADDRESS(element) )
        {
            TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            TY_(InsertNodeAtEnd)(element, node);
            (*node->tag->parser)( doc, node, mode );
            continue;
        }

        /* ignore unknown and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node );
            continue;
        }

        if ( nodeIsBR(node) && node->type == EndTag )
            node->type = StartTag;

        if ( node->type == EndTag )
        {
           /* coerce </br> to <br> */
           if ( nodeIsBR(node) )
                node->type = StartTag;
           else if ( nodeIsP(node) )
           {
               /* coerce unmatched </p> to <br><br> */
                if ( !DescendantOf(element, TidyTag_P) )
                {
                    TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                    TrimSpaces( doc, element );
                    TY_(InsertNodeAtEnd)( element, node );
                    node = TY_(InferredTag)(doc, TidyTag_BR);
                    TY_(InsertNodeAtEnd)( element, node ); /* todo: check this */
                    continue;
                }
           }
           else if ( TY_(nodeHasCM)(node, CM_INLINE)
                     && !nodeIsA(node)
                     && !TY_(nodeHasCM)(node, CM_OBJECT)
                     && TY_(nodeHasCM)(element, CM_INLINE) )
            {
                /* allow any inline end tag to end current element */

                /* http://tidy.sf.net/issue/1426419 */
                /* but, like the browser, retain an earlier inline element.
                   This is implemented by setting the lexer into a mode
                   where it gets tokens from the inline stack rather than
                   from the input stream. Check if the scenerio fits. */
                if ( !nodeIsA(element)
                     && (node->tag != element->tag)
                     && TY_(IsPushed)( doc, node )
                     && TY_(IsPushed)( doc, element ) )
                {
                    /* we have something like
                       <b>bold <i>bold and italic</b> italics</i> */
                    if ( TY_(SwitchInline)( doc, element, node ) )
                    {
                        TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG);
                        TY_(UngetToken)( doc ); /* put this back */
                        TY_(InlineDup1)( doc, NULL, element ); /* dupe the <i>, after </b> */
                        if (!(mode & Preformatted))
                            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_inline--;
                        SPRTF("Exit ParseInline 4 %d...\n",in_parse_inline);
#endif
                        return; /* close <i>, but will re-open it, after </b> */
                    }
                }
                TY_(PopInline)( doc, element );

                if ( !nodeIsA(element) )
                {
                    if ( nodeIsA(node) && node->tag != element->tag )
                    {
                       TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                       TY_(UngetToken)( doc );
                    }
                    else
                    {
                        TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG);
                        TY_(FreeNode)( doc, node);
                    }

                    if (!(mode & Preformatted))
                        TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 5 %d...\n",in_parse_inline);
#endif
                    return;
                }

                /* if parent is <a> then discard unexpected inline end tag */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }  /* special case </tr> etc. for stuff moved in front of table */
            else if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
            {
                TY_(UngetToken)( doc );
                TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_inline--;
                SPRTF("Exit ParseInline 6 %d...\n",in_parse_inline);
#endif
                return;
            }
        }

        /* allow any header tag to end current header */
        if ( TY_(nodeHasCM)(node, CM_HEADING) && TY_(nodeHasCM)(element, CM_HEADING) )
        {

            if ( node->tag == element->tag )
            {
                TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG );
                TY_(FreeNode)( doc, node);
            }
            else
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                TY_(UngetToken)( doc );
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 7 %d...\n",in_parse_inline);
#endif
            return;
        }

        /*
           an <A> tag to ends any open <A> element
           but <A href=...> is mapped to </A><A href=...>
        */
        /* #427827 - fix by Randy Waki and Bjoern Hoehrmann 23 Aug 00 */
        /* if (node->tag == doc->tags.tag_a && !node->implicit && TY_(IsPushed)(doc, node)) */
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            /* coerce <a> to </a> unless it has some attributes */
            /* #427827 - fix by Randy Waki and Bjoern Hoehrmann 23 Aug 00 */
            /* other fixes by Dave Raggett */
            /* if (node->attributes == NULL) */
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                /* TY_(PopInline)( doc, node ); */
                TY_(UngetToken)( doc );
                continue;
            }

            TY_(UngetToken)( doc );
            TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
            /* TY_(PopInline)( doc, element ); */

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 8 %d...\n",in_parse_inline);
#endif
            return;
        }

        if (element->tag->model & CM_HEADING)
        {
            if ( nodeIsCENTER(node) || nodeIsDIV(node) )
            {
                if (!TY_(nodeIsElement)(node))
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);

                /* insert center as parent if heading is empty */
                if (element->content == NULL)
                {
                    InsertNodeAsParent(element, node);
                    continue;
                }

                /* split heading and make center parent of 2nd part */
                TY_(InsertNodeAfterElement)(element, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAtEnd)(node, element);
                continue;
            }

            if ( nodeIsHR(node) )
            {
                if ( !TY_(nodeIsElement)(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);

                /* insert hr before heading if heading is empty */
                if (element->content == NULL)
                {
                    TY_(InsertNodeBeforeElement)(element, node);
                    continue;
                }

                /* split heading and insert hr before 2nd part */
                TY_(InsertNodeAfterElement)(element, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAfterElement)(node, element);
                continue;
            }
        }

        if ( nodeIsDT(element) )
        {
            if ( nodeIsHR(node) )
            {
                Node *dd;
                if ( !TY_(nodeIsElement)(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);
                dd = TY_(InferredTag)(doc, TidyTag_DD);

                /* insert hr within dd before dt if dt is empty */
                if (element->content == NULL)
                {
                    TY_(InsertNodeBeforeElement)(element, dd);
                    TY_(InsertNodeAtEnd)(dd, node);
                    continue;
                }

                /* split dt and insert hr within dd before 2nd part */
                TY_(InsertNodeAfterElement)(element, dd);
                TY_(InsertNodeAtEnd)(dd, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAfterElement)(dd, element);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            for (parent = element->parent;
                    parent != NULL; parent = parent->parent)
            {
                if (node->tag == parent->tag)
                {
                    if (!(element->tag->model & CM_OPT) && !element->implicit)
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);

                    if( TY_(IsPushedLast)( doc, element, node ) ) 
                        TY_(PopInline)( doc, element );
                    TY_(UngetToken)( doc );

                    if (!(mode & Preformatted))
                        TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 9 %d...\n",in_parse_inline);
#endif
                    return;
                }
            }
        }

        /*\
         *  block level tags end this element 
         *  Issue #333 - There seems an exception if the element is a 'span',
         *  and the node just collected is a 'meta'. The 'meta' can not have
         *  CM_INLINE added, nor can the 'span' have CM_MIXED added without
         *  big consequences.
         *  There may be other exceptions to be added...
        \*/
        if (!(node->tag->model & CM_INLINE) &&
            !(element->tag->model & CM_MIXED) &&
            !(nodeIsSPAN(element) && nodeIsMETA(node)) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
            /* HTML5 */
            if (nodeIsDATALIST(element)) {
                TY_(ConstrainVersion)( doc, ~VERS_HTML5 );
            } else
            if (!(element->tag->model & CM_OPT))
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);

            if (node->tag->model & CM_HEAD && !(node->tag->model & CM_BLOCK))
            {
                MoveToHead(doc, element, node);
                continue;
            }

            /*
               prevent anchors from propagating into block tags
               except for headings h1 to h6
            */
            if ( nodeIsA(element) )
            {
                if (node->tag && !(node->tag->model & CM_HEADING))
                    TY_(PopInline)( doc, element );
                else if (!(element->content))
                {
                    TY_(DiscardElement)( doc, element );
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 10 %d...\n",in_parse_inline);
#endif
                    return;
                }
            }

            TY_(UngetToken)( doc );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 11 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* parse inline element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG);

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces(doc, element);
            
            TY_(InsertNodeAtEnd)(element, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_inline--;
    SPRTF("Exit ParseInline 12 %d...\n",in_parse_inline);
#endif
}